

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void gen_compare_and_swap_pair(DisasContext_conflict1 *s,int rs,int rt,int rn,int size)

{
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_7;
  TCGv_i64 arg2;
  TCGv_i64 arg2_00;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 addr;
  TCGv_i64 val;
  TCGv_i64 pTVar3;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 c2;
  TCGv_i32 pTVar4;
  uintptr_t o;
  code *func;
  uintptr_t o_1;
  uintptr_t o_4;
  ulong idx;
  uintptr_t o_3;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGv_i64 local_48;
  TCGv_i64 local_40;
  TCGv_i64 local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  arg2 = cpu_reg_aarch64(s,rs);
  arg2_00 = cpu_reg_aarch64(s,rs + 1);
  pTVar1 = cpu_reg_aarch64(s,rt);
  pTVar2 = cpu_reg_aarch64(s,rt + 1);
  idx = (ulong)(s->mmu_idx & 0xf);
  addr = clean_data_tbi(s,s->uc->tcg_ctx->cpu_X[rn]);
  if (size == 2) {
    val = tcg_temp_new_i64(tcg_ctx);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    if (s->be_data == MO_8) {
      tcg_gen_concat32_i64(tcg_ctx,pTVar3,pTVar1,pTVar2);
      pTVar1 = arg2_00;
      pTVar2 = arg2;
    }
    else {
      tcg_gen_concat32_i64(tcg_ctx,pTVar3,pTVar2,pTVar1);
      pTVar1 = arg2;
      pTVar2 = arg2_00;
    }
    tcg_gen_concat32_i64(tcg_ctx,val,pTVar2,pTVar1);
    tcg_gen_atomic_cmpxchg_i64_aarch64
              (tcg_ctx,val,addr,val,pTVar3,idx,s->be_data | (MO_ALIGN|MO_64));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    pTVar1 = arg2_00;
    if (s->be_data != MO_8) {
      pTVar1 = arg2;
      arg2 = arg2_00;
    }
    tcg_gen_extr32_i64_aarch64(tcg_ctx,arg2,pTVar1,val);
  }
  else {
    if ((((s->base).tb)->cflags & 0x80000) != 0) {
      pTVar4 = tcg_const_i32_aarch64(tcg_ctx,rs);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_48 = addr + (long)tcg_ctx;
      local_40 = pTVar1 + (long)tcg_ctx;
      if (s->be_data == MO_8) {
        func = helper_casp_le_parallel_aarch64;
      }
      else {
        func = helper_casp_be_parallel_aarch64;
      }
      local_38 = pTVar2 + (long)tcg_ctx;
      local_50 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)0x0,5,&local_58);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      return;
    }
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    val = tcg_temp_new_i64(tcg_ctx);
    ret = tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    ret_01 = tcg_temp_new_i64(tcg_ctx);
    c2 = tcg_const_i64_aarch64(tcg_ctx,0);
    tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,pTVar3,addr,idx,s->be_data | (MO_ALIGN_16|MO_64));
    tcg_gen_addi_i64_aarch64(tcg_ctx,ret,addr,8);
    tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,val,ret,idx,s->be_data | MO_64);
    tcg_gen_setcond_i64_aarch64(tcg_ctx,TCG_COND_EQ,ret_00,pTVar3,arg2);
    tcg_gen_setcond_i64_aarch64(tcg_ctx,TCG_COND_EQ,ret_01,val,arg2_00);
    tcg_gen_and_i64_aarch64(tcg_ctx,ret_01,ret_01,ret_00);
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_NE,ret_00,ret_01,c2,pTVar1,pTVar3);
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_NE,ret_01,ret_01,c2,pTVar2,val);
    tcg_gen_qemu_st_i64_aarch64(tcg_ctx,ret_00,addr,idx,s->be_data | MO_64);
    tcg_gen_qemu_st_i64_aarch64(tcg_ctx,ret_01,ret,idx,s->be_data | MO_64);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
    tcg_gen_mov_i64_aarch64(tcg_ctx,arg2,pTVar3);
    tcg_gen_mov_i64_aarch64(tcg_ctx,arg2_00,val);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_compare_and_swap_pair(DisasContext *s, int rs, int rt,
                                      int rn, int size)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 s1 = cpu_reg(s, rs);
    TCGv_i64 s2 = cpu_reg(s, rs + 1);
    TCGv_i64 t1 = cpu_reg(s, rt);
    TCGv_i64 t2 = cpu_reg(s, rt + 1);
    TCGv_i64 clean_addr;
    int memidx = get_mem_index(s);

    if (rn == 31) {
        gen_check_sp_alignment(s);
    }
    clean_addr = clean_data_tbi(s, cpu_reg_sp(s, rn));

    if (size == 2) {
        TCGv_i64 cmp = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);

        if (s->be_data == MO_LE) {
            tcg_gen_concat32_i64(tcg_ctx, val, t1, t2);
            tcg_gen_concat32_i64(tcg_ctx, cmp, s1, s2);
        } else {
            tcg_gen_concat32_i64(tcg_ctx, val, t2, t1);
            tcg_gen_concat32_i64(tcg_ctx, cmp, s2, s1);
        }

        tcg_gen_atomic_cmpxchg_i64(tcg_ctx, cmp, clean_addr, cmp, val, memidx,
                                   MO_64 | MO_ALIGN | s->be_data);
        tcg_temp_free_i64(tcg_ctx, val);

        if (s->be_data == MO_LE) {
            tcg_gen_extr32_i64(tcg_ctx, s1, s2, cmp);
        } else {
            tcg_gen_extr32_i64(tcg_ctx, s2, s1, cmp);
        }
        tcg_temp_free_i64(tcg_ctx, cmp);
    } else if (tb_cflags(s->base.tb) & CF_PARALLEL) {
        if (HAVE_CMPXCHG128) {
            TCGv_i32 tcg_rs = tcg_const_i32(tcg_ctx, rs);
            if (s->be_data == MO_LE) {
                gen_helper_casp_le_parallel(tcg_ctx, tcg_ctx->cpu_env, tcg_rs,
                                            clean_addr, t1, t2);
            } else {
                gen_helper_casp_be_parallel(tcg_ctx, tcg_ctx->cpu_env, tcg_rs,
                                            clean_addr, t1, t2);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_rs);
        } else {
            gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
            s->base.is_jmp = DISAS_NORETURN;
        }
    } else {
        TCGv_i64 d1 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 d2 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 a2 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 c1 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 c2 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 zero = tcg_const_i64(tcg_ctx, 0);

        /* Load the two words, in memory order.  */
        tcg_gen_qemu_ld_i64(tcg_ctx, d1, clean_addr, memidx,
                            MO_64 | MO_ALIGN_16 | s->be_data);
        tcg_gen_addi_i64(tcg_ctx, a2, clean_addr, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, d2, a2, memidx, MO_64 | s->be_data);

        /* Compare the two words, also in memory order.  */
        tcg_gen_setcond_i64(tcg_ctx, TCG_COND_EQ, c1, d1, s1);
        tcg_gen_setcond_i64(tcg_ctx, TCG_COND_EQ, c2, d2, s2);
        tcg_gen_and_i64(tcg_ctx, c2, c2, c1);

        /* If compare equal, write back new data, else write back old data.  */
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, c1, c2, zero, t1, d1);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, c2, c2, zero, t2, d2);
        tcg_gen_qemu_st_i64(tcg_ctx, c1, clean_addr, memidx, MO_64 | s->be_data);
        tcg_gen_qemu_st_i64(tcg_ctx, c2, a2, memidx, MO_64 | s->be_data);
        tcg_temp_free_i64(tcg_ctx, a2);
        tcg_temp_free_i64(tcg_ctx, c1);
        tcg_temp_free_i64(tcg_ctx, c2);
        tcg_temp_free_i64(tcg_ctx, zero);

        /* Write back the data from memory to Rs.  */
        tcg_gen_mov_i64(tcg_ctx, s1, d1);
        tcg_gen_mov_i64(tcg_ctx, s2, d2);
        tcg_temp_free_i64(tcg_ctx, d1);
        tcg_temp_free_i64(tcg_ctx, d2);
    }
}